

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeView::mouseReleaseEvent(QTreeView *this,QMouseEvent *event)

{
  QTreeViewPrivate *this_00;
  int iVar1;
  State SVar2;
  QStyle *pQVar3;
  long in_FS_OFFSET;
  QPointF local_38;
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  local_38 = QSinglePointEvent::position((QSinglePointEvent *)event);
  local_28 = QPointF::toPoint(&local_38);
  iVar1 = QTreeViewPrivate::itemDecorationAt(this_00,&local_28);
  if (iVar1 == -1) {
    QAbstractItemView::mouseReleaseEvent((QAbstractItemView *)this,event);
    goto LAB_00543d94;
  }
  SVar2 = QAbstractItemView::state((QAbstractItemView *)this);
  if (SVar2 == DragSelectingState) {
LAB_00543d2f:
    QAbstractItemView::setState((QAbstractItemView *)this,NoState);
  }
  else {
    SVar2 = QAbstractItemView::state((QAbstractItemView *)this);
    if (SVar2 == DraggingState) goto LAB_00543d2f;
  }
  pQVar3 = QWidget::style((QWidget *)this);
  iVar1 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x28,0,this,0);
  if (iVar1 == 3) {
    local_38 = QSinglePointEvent::position((QSinglePointEvent *)event);
    local_28 = QPointF::toPoint(&local_38);
    QTreeViewPrivate::expandOrCollapseItemAtPos(this_00,&local_28);
  }
LAB_00543d94:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::mouseReleaseEvent(QMouseEvent *event)
{
    Q_D(QTreeView);
    if (d->itemDecorationAt(event->position().toPoint()) == -1) {
        QAbstractItemView::mouseReleaseEvent(event);
    } else {
        if (state() == QAbstractItemView::DragSelectingState || state() == QAbstractItemView::DraggingState)
            setState(QAbstractItemView::NoState);
        if (style()->styleHint(QStyle::SH_ListViewExpand_SelectMouseType, nullptr, this) == QEvent::MouseButtonRelease)
            d->expandOrCollapseItemAtPos(event->position().toPoint());
    }
}